

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect.c
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  char cVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  FILE *__stream;
  size_t sVar5;
  long lVar6;
  uint *puVar7;
  wasm_externtype_t *pwVar8;
  char *__s;
  ulong uVar9;
  wasm_extern_vec_t exports;
  wasm_exporttype_vec_t export_types;
  wasm_byte_vec_t binary;
  ulong local_80;
  long local_78;
  ulong local_70;
  long local_68;
  long local_60;
  long local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined1 local_40 [8];
  void *local_38;
  
  puts("Initializing...");
  uVar3 = wasm_engine_new();
  uVar4 = wasm_store_new(uVar3);
  puts("Loading binary...");
  __stream = fopen("reflect.wasm","r");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    sVar5 = ftell(__stream);
    fseek(__stream,0,0);
    wasm_byte_vec_new_uninitialized(local_40,sVar5);
    sVar5 = fread(local_38,sVar5,1,__stream);
    if (sVar5 == 1) {
      fclose(__stream);
      puts("Compiling module...");
      lVar6 = wasm_module_new(uVar4,local_40);
      if (lVar6 == 0) {
        __s = "> Error compiling module!";
      }
      else {
        wasm_byte_vec_delete(local_40);
        puts("Instantiating module...");
        local_60 = wasm_instance_new(uVar4,lVar6,0,0);
        if (local_60 != 0) {
          local_50 = uVar4;
          local_48 = uVar3;
          puts("Extracting export...");
          local_58 = lVar6;
          wasm_module_exports(lVar6,&local_70);
          wasm_instance_exports(local_60,&local_80);
          if (local_80 != local_70) {
            __assert_fail("exports.size == export_types.size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/third_party/wasm-c-api/example/reflect.c"
                          ,0x85,"int main(int, const char **)");
          }
          if (local_80 != 0) {
            uVar9 = 0;
            do {
              cVar1 = wasm_extern_kind(*(undefined8 *)(local_78 + uVar9 * 8));
              uVar3 = wasm_exporttype_type(*(undefined8 *)(local_68 + uVar9 * 8));
              cVar2 = wasm_externtype_kind(uVar3);
              if (cVar1 != cVar2) {
                __assert_fail("wasm_extern_kind(exports.data[i]) == wasm_externtype_kind(wasm_exporttype_type(export_types.data[i]))"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/third_party/wasm-c-api/example/reflect.c"
                              ,0x89,"int main(int, const char **)");
              }
              printf("> export %zu ",uVar9);
              puVar7 = (uint *)wasm_exporttype_name(*(undefined8 *)(local_68 + uVar9 * 8));
              printf("\"%.*s\"",(ulong)*puVar7,*(undefined8 *)(puVar7 + 2));
              putchar(10);
              printf(">> initial: ");
              pwVar8 = (wasm_externtype_t *)
                       wasm_exporttype_type(*(undefined8 *)(local_68 + uVar9 * 8));
              print_externtype(pwVar8);
              putchar(10);
              printf(">> current: ");
              pwVar8 = (wasm_externtype_t *)wasm_extern_type(*(undefined8 *)(local_78 + uVar9 * 8));
              print_externtype(pwVar8);
              wasm_externtype_delete(pwVar8);
              putchar(10);
              cVar1 = wasm_extern_kind(*(undefined8 *)(local_78 + uVar9 * 8));
              if (cVar1 == '\0') {
                uVar3 = wasm_extern_as_func(*(undefined8 *)(local_78 + uVar9 * 8));
                uVar4 = wasm_func_param_arity(uVar3);
                printf(">> in-arity: %zu",uVar4);
                uVar3 = wasm_func_result_arity(uVar3);
                printf(", out-arity: %zu\n",uVar3);
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 < local_80);
          }
          wasm_module_delete(local_58);
          wasm_instance_delete(local_60);
          wasm_extern_vec_delete(&local_80);
          wasm_exporttype_vec_delete(&local_70);
          puts("Shutting down...");
          wasm_store_delete(local_50);
          wasm_engine_delete(local_48);
          puts("Done.");
          return 0;
        }
        __s = "> Error instantiating module!";
      }
      goto LAB_00102931;
    }
  }
  __s = "> Error loading module!";
LAB_00102931:
  puts(__s);
  return 1;
}

Assistant:

int main(int argc, const char* argv[]) {
  // Initialize.
  printf("Initializing...\n");
  wasm_engine_t* engine = wasm_engine_new();
  wasm_store_t* store = wasm_store_new(engine);

  // Load binary.
  printf("Loading binary...\n");
  FILE* file = fopen("reflect.wasm", "r");
  if (!file) {
    printf("> Error loading module!\n");
    return 1;
  }
  fseek(file, 0L, SEEK_END);
  size_t file_size = ftell(file);
  fseek(file, 0L, SEEK_SET);
  wasm_byte_vec_t binary;
  wasm_byte_vec_new_uninitialized(&binary, file_size);
  if (fread(binary.data, file_size, 1, file) != 1) {
    printf("> Error loading module!\n");
    return 1;
  }
  fclose(file);

  // Compile.
  printf("Compiling module...\n");
  own wasm_module_t* module = wasm_module_new(store, &binary);
  if (!module) {
    printf("> Error compiling module!\n");
    return 1;
  }

  wasm_byte_vec_delete(&binary);

  // Instantiate.
  printf("Instantiating module...\n");
  own wasm_instance_t* instance = wasm_instance_new(store, module, NULL, NULL);
  if (!instance) {
    printf("> Error instantiating module!\n");
    return 1;
  }

  // Extract export.
  printf("Extracting export...\n");
  own wasm_exporttype_vec_t export_types;
  own wasm_extern_vec_t exports;
  wasm_module_exports(module, &export_types);
  wasm_instance_exports(instance, &exports);
  assert(exports.size == export_types.size);

  for (size_t i = 0; i < exports.size; ++i) {
    assert(wasm_extern_kind(exports.data[i]) ==
      wasm_externtype_kind(wasm_exporttype_type(export_types.data[i])));
    printf("> export %zu ", i);
    print_name(wasm_exporttype_name(export_types.data[i]));
    printf("\n");
    printf(">> initial: ");
    print_externtype(wasm_exporttype_type(export_types.data[i]));
    printf("\n");
    printf(">> current: ");
    own wasm_externtype_t* current = wasm_extern_type(exports.data[i]);
    print_externtype(current);
    wasm_externtype_delete(current);
    printf("\n");
    if (wasm_extern_kind(exports.data[i]) == WASM_EXTERN_FUNC) {
      wasm_func_t* func = wasm_extern_as_func(exports.data[i]);
      printf(">> in-arity: %zu", wasm_func_param_arity(func));
      printf(", out-arity: %zu\n", wasm_func_result_arity(func));
    }
  }

  wasm_module_delete(module);
  wasm_instance_delete(instance);
  wasm_extern_vec_delete(&exports);
  wasm_exporttype_vec_delete(&export_types);

  // Shut down.
  printf("Shutting down...\n");
  wasm_store_delete(store);
  wasm_engine_delete(engine);

  // All done.
  printf("Done.\n");
  return 0;
}